

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UChar * icu_63::TimeZone::getRegion(UnicodeString *id,UErrorCode *status)

{
  UBool UVar1;
  int32_t indexS;
  UResourceBundle *resB;
  UResourceBundle *array;
  UResourceBundle *pUVar2;
  UChar *tmp;
  int32_t idx;
  UResourceBundle *res;
  UResourceBundle *rb;
  UChar *result;
  UErrorCode *status_local;
  UnicodeString *id_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    rb = (UResourceBundle *)0x0;
    resB = ures_openDirect_63((char *)0x0,"zoneinfo64",status);
    array = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,status);
    indexS = findInStringArray(array,id,status);
    ures_getByKey_63(resB,"Regions",array,status);
    pUVar2 = (UResourceBundle *)ures_getStringByIndex_63(array,indexS,(int32_t *)0x0,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      rb = pUVar2;
    }
    ures_close_63(array);
    ures_close_63(resB);
    id_local = (UnicodeString *)rb;
  }
  else {
    id_local = (UnicodeString *)0x0;
  }
  return (UChar *)id_local;
}

Assistant:

const UChar*
TimeZone::getRegion(const UnicodeString& id, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    const UChar *result = NULL;
    UResourceBundle *rb = ures_openDirect(NULL, kZONEINFO, &status);

    // resolve zone index by name
    UResourceBundle *res = ures_getByKey(rb, kNAMES, NULL, &status);
    int32_t idx = findInStringArray(res, id, status);

    // get region mapping
    ures_getByKey(rb, kREGIONS, res, &status);
    const UChar *tmp = ures_getStringByIndex(res, idx, NULL, &status);
    if (U_SUCCESS(status)) {
        result = tmp;
    }

    ures_close(res);
    ures_close(rb);

    return result;
}